

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O3

void __thiscall cppforth::Forth::resizeFile(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  char cVar1;
  uint handler;
  uint uVar2;
  uint uVar3;
  openmode oVar4;
  basic_fstream<char,_std::char_traits<char>_> *__p;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> fnew;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  string filename;
  path local_98;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> local_70;
  long *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  string local_50;
  
  requireDStackDepth(this,3,"RESIZE-FILE");
  this_00 = &this->dStack;
  handler = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  local_98._M_pathname._M_dataplus._M_p = (pointer)&local_98._M_pathname.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"RESIZE-FILE","");
  GetFileHandle((Forth *)&local_60,(Cell)this,(string *)(ulong)handler,(errorCodes)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_pathname._M_dataplus._M_p != &local_98._M_pathname.field_2) {
    operator_delete(local_98._M_pathname._M_dataplus._M_p,
                    local_98._M_pathname.field_2._M_allocated_capacity + 1);
  }
  uVar2 = ForthStack<unsigned_int>::getTop(this_00,1);
  uVar3 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  local_98._M_pathname._M_dataplus._M_p = (pointer)&local_98._M_pathname.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"RESIZE-FILE","");
  oVar4 = GetFileAccessMode(this,handler,&local_98._M_pathname,errorResizeFile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_pathname._M_dataplus._M_p != &local_98._M_pathname.field_2) {
    operator_delete(local_98._M_pathname._M_dataplus._M_p,
                    local_98._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_98._M_pathname._M_dataplus._M_p = (pointer)&local_98._M_pathname.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"RESIZE-FILE","");
  GetFileName(&local_50,this,handler,&local_98._M_pathname,errorResizeFile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_pathname._M_dataplus._M_p != &local_98._M_pathname.field_2) {
    operator_delete(local_98._M_pathname._M_dataplus._M_p,
                    local_98._M_pathname.field_2._M_allocated_capacity + 1);
  }
  std::ios::clear((int)local_60 + (int)*(undefined8 *)(*local_60 + -0x18));
  std::fstream::close();
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_98,&local_50,auto_format);
  std::filesystem::resize_file(&local_98,CONCAT44(uVar3,uVar2));
  std::filesystem::__cxx11::path::~path(&local_98);
  __p = (basic_fstream<char,_std::char_traits<char>_> *)operator_new(0x210);
  std::fstream::fstream(__p,(string *)&local_50,oVar4);
  local_70.
  super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::fstream*>
            (&local_70.
              super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,__p);
  cVar1 = std::__basic_file<char>::is_open();
  uVar2 = 0xffffffb6;
  if (cVar1 != '\0') {
    local_98._M_pathname._M_dataplus._M_p = (pointer)&local_98._M_pathname.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"RESIZE-FILE","");
    MoveFileHandle(this,handler,&local_70,&local_98._M_pathname,errorResizeFile);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_pathname._M_dataplus._M_p != &local_98._M_pathname.field_2) {
      operator_delete(local_98._M_pathname._M_dataplus._M_p,
                      local_98._M_pathname.field_2._M_allocated_capacity + 1);
    }
    uVar2 = 0;
  }
  ForthStack<unsigned_int>::setTop(this_00,uVar2);
  if (local_70.
      super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.
               super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

void resizeFile() {
	REQUIRE_DSTACK_DEPTH(3, "RESIZE-FILE");
	auto h = (dStack.getTop()); pop();
	auto f = GetFileHandle(h, "RESIZE-FILE", errorResizeFile);
	DCell ud(dStack.getTop(1), dStack.getTop()); dStack.pop();

	auto fam = GetFileAccessMode(h, "RESIZE-FILE", errorResizeFile);
	std::string filename=GetFileName(h, "RESIZE-FILE", errorResizeFile);
	f->clear();
	f->close();
	std::filesystem::resize_file(filename,ud.data_.Dcells);
	try {
		std::shared_ptr<std::fstream> fnew{ new std::fstream(filename, fam  ) };
		if (fnew->is_open()) {
			//auto filesize = std::filesystem::file_size(filename);
			MoveFileHandle(h,  fnew,  "RESIZE-FILE", errorResizeFile);
			dStack.setTop(0);
		}
		else {
			dStack.setTop(Cell(errorResizeFile));
		}
	}
	catch (std::exception&) {
		dStack.setTop(Cell(errorResizeFile));
	}
}